

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O0

void __thiscall
VW::object_pool<example,_example_initializer>::new_chunk
          (object_pool<example,_example_initializer> *this,size_t size)

{
  undefined1 auVar1 [16];
  example_initializer *this_00;
  ulong uVar2;
  example *peVar3;
  type __s;
  ulong in_RSI;
  long in_RDI;
  size_t i;
  value_type *chunk;
  example *in_stack_ffffffffffffff38;
  type in_stack_ffffffffffffff40;
  example *in_stack_ffffffffffffff78;
  ulong local_58;
  type local_50;
  type local_48;
  pair<example_*,_example_*> local_40;
  reference local_30;
  ulong local_10;
  
  if (in_RSI != 0) {
    this_00 = (example_initializer *)(in_RDI + 0x90);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RSI;
    uVar2 = SUB168(auVar1 * ZEXT816(0x68d0),0);
    if (SUB168(auVar1 * ZEXT816(0x68d0),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    local_10 = in_RSI;
    peVar3 = (example *)operator_new__(uVar2);
    if (in_RSI != 0) {
      in_stack_ffffffffffffff78 = peVar3;
      do {
        example::example((example *)0x19b1f5);
        in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 + 1;
      } while (in_stack_ffffffffffffff78 != peVar3 + in_RSI);
    }
    std::unique_ptr<example[],std::default_delete<example[]>>::
    unique_ptr<example*,std::default_delete<example[]>,void,bool>
              ((unique_ptr<example[],_std::default_delete<example[]>_> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    std::
    vector<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
    ::push_back((vector<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
                 *)in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
    std::unique_ptr<example[],_std::default_delete<example[]>_>::~unique_ptr
              ((unique_ptr<example[],_std::default_delete<example[]>_> *)in_stack_ffffffffffffff40);
    local_30 = std::
               vector<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
               ::back((vector<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
                       *)in_stack_ffffffffffffff40);
    local_48 = std::unique_ptr<example[],_std::default_delete<example[]>_>::operator[]
                         ((unique_ptr<example[],_std::default_delete<example[]>_> *)
                          in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
    local_50 = std::unique_ptr<example[],_std::default_delete<example[]>_>::operator[]
                         ((unique_ptr<example[],_std::default_delete<example[]>_> *)
                          in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
    std::pair<example_*,_example_*>::pair<example_*,_example_*,_true>(&local_40,&local_48,&local_50)
    ;
    std::vector<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
    ::push_back((vector<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
                 *)in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
    for (local_58 = 0; local_58 < local_10; local_58 = local_58 + 1) {
      __s = std::unique_ptr<example[],_std::default_delete<example[]>_>::operator[]
                      ((unique_ptr<example[],_std::default_delete<example[]>_> *)
                       in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
      memset(__s,0,0x68d0);
      in_stack_ffffffffffffff40 =
           std::unique_ptr<example[],_std::default_delete<example[]>_>::operator[]
                     ((unique_ptr<example[],_std::default_delete<example[]>_> *)
                      in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
      memset(in_stack_ffffffffffffff40,0,0x68d0);
      example::example((example *)0x19b340);
      std::unique_ptr<example[],_std::default_delete<example[]>_>::operator[]
                ((unique_ptr<example[],_std::default_delete<example[]>_> *)in_stack_ffffffffffffff40
                 ,(size_t)in_stack_ffffffffffffff38);
      example_initializer::operator()(this_00,in_stack_ffffffffffffff78);
      std::queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_>::push
                ((queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_> *)
                 in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
    }
  }
  return;
}

Assistant:

void new_chunk(size_t size)
  {
    if(size == 0)
    {
      return;
    }

    m_chunks.push_back(std::unique_ptr<T[]>(new T[size]));
    auto& chunk = m_chunks.back();
    m_chunk_bounds.push_back({&chunk[0], &chunk[size - 1]});

    for (size_t i = 0; i < size; i++)
    {
      memset(&chunk[i], 0, sizeof(T));
      new (&chunk[i]) T{};
      m_pool.push(m_initializer(&chunk[i]));
    }
  }